

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O2

void emitter_json_object_kv_begin(emitter_t *emitter,char *json_key)

{
  emitter_json_key(emitter,json_key);
  emitter_json_object_begin(emitter);
  return;
}

Assistant:

static inline void
emitter_json_object_kv_begin(emitter_t *emitter, const char *json_key) {
	emitter_json_key(emitter, json_key);
	emitter_json_object_begin(emitter);
}